

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::CreationTest::iterate(CreationTest *this)

{
  ostringstream *poVar1;
  GLenum GVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  ContextType ctxType;
  deUint32 dVar7;
  undefined4 extraout_var;
  char *description;
  GLuint (*paGVar9) [2];
  GLuint i;
  long lVar10;
  qpTestResult testResult;
  TestContext *this_00;
  GLuint *pGVar11;
  long lVar12;
  GLuint textures_legacy [2];
  Enum<int,_2UL> local_218;
  GLuint textures_dsa [11] [2];
  undefined1 local_1b0 [384];
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar3) || (bVar4)) {
    textures_legacy[0] = 0;
    textures_legacy[1] = 0;
    textures_dsa[8][0] = 0;
    textures_dsa[8][1] = 0;
    textures_dsa[9][0] = 0;
    textures_dsa[9][1] = 0;
    textures_dsa[6][0] = 0;
    textures_dsa[6][1] = 0;
    textures_dsa[7][0] = 0;
    textures_dsa[7][1] = 0;
    textures_dsa[4][0] = 0;
    textures_dsa[4][1] = 0;
    textures_dsa[5][0] = 0;
    textures_dsa[5][1] = 0;
    textures_dsa[2][0] = 0;
    textures_dsa[2][1] = 0;
    textures_dsa[3][0] = 0;
    textures_dsa[3][1] = 0;
    textures_dsa[0][0] = 0;
    textures_dsa[0][1] = 0;
    textures_dsa[1][0] = 0;
    textures_dsa[1][1] = 0;
    textures_dsa[10][0] = 0;
    textures_dsa[10][1] = 0;
    (**(code **)(lVar8 + 0x6f8))(2);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x7b);
    bVar3 = true;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      cVar5 = (**(code **)(lVar8 + 0xcc8))(textures_legacy[lVar12]);
      if (cVar5 != '\0') {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "GenTextures has created default objects, but it should create only a names."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        bVar3 = false;
      }
    }
    paGVar9 = textures_dsa;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    for (lVar12 = 0; lVar12 != 0xb; lVar12 = lVar12 + 1) {
      GVar2 = iterate::texture_targets[lVar12];
      (**(code **)(lVar8 + 0x400))(GVar2,2,textures_dsa + lVar12);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"glCreateTextures has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x8f);
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        cVar5 = (**(code **)(lVar8 + 0xcc8))((*paGVar9)[lVar10]);
        if (cVar5 == '\0') {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,
                          "CreateTextures has not created default objects for target ");
          local_218.m_getName = glu::getTextureTargetName;
          local_218.m_value = GVar2;
          tcu::Format::Enum<int,_2UL>::toStream(&local_218,(ostream *)poVar1);
          std::operator<<((ostream *)poVar1,".");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          bVar3 = false;
        }
      }
      paGVar9 = paGVar9 + 1;
    }
    pGVar11 = textures_dsa[0];
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      if (textures_legacy[lVar12] != 0) {
        (**(code **)(lVar8 + 0x480))(1);
        textures_legacy[lVar12] = 0;
      }
      for (lVar10 = 0; lVar10 != 0x58; lVar10 = lVar10 + 8) {
        if (*(int *)((long)pGVar11 + lVar10) != 0) {
          (**(code **)(lVar8 + 0x480))(1);
          *(undefined4 *)((long)pGVar11 + lVar10) = 0;
        }
      }
      pGVar11 = pGVar11 + 1;
    }
    do {
      iVar6 = (**(code **)(lVar8 + 0x800))();
    } while (iVar6 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar3) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Textures' objects */
	static const glw::GLenum texture_targets[] = { GL_TEXTURE_1D,
												   GL_TEXTURE_2D,
												   GL_TEXTURE_3D,
												   GL_TEXTURE_1D_ARRAY,
												   GL_TEXTURE_2D_ARRAY,
												   GL_TEXTURE_RECTANGLE,
												   GL_TEXTURE_CUBE_MAP,
												   GL_TEXTURE_CUBE_MAP_ARRAY,
												   GL_TEXTURE_BUFFER,
												   GL_TEXTURE_2D_MULTISAMPLE,
												   GL_TEXTURE_2D_MULTISAMPLE_ARRAY };
	static const glw::GLuint texture_targets_count = sizeof(texture_targets) / sizeof(texture_targets[0]);
	static const glw::GLuint textures_count		   = 2;

	glw::GLuint textures_legacy[textures_count]						= {};
	glw::GLuint textures_dsa[texture_targets_count][textures_count] = {};

	try
	{
		/* Check legacy state creation. */
		gl.genTextures(textures_count, textures_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		for (glw::GLuint i = 0; i < textures_count; ++i)
		{
			if (gl.isTexture(textures_legacy[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GenTextures has created default objects, but it should create only a names."
					<< tcu::TestLog::EndMessage;
			}
		}

		/* Check direct state creation. */
		for (glw::GLuint j = 0; j < texture_targets_count; ++j)
		{
			gl.createTextures(texture_targets[j], textures_count, textures_dsa[j]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

			for (glw::GLuint i = 0; i < textures_count; ++i)
			{
				if (!gl.isTexture(textures_dsa[j][i]))
				{
					is_ok = false;

					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "CreateTextures has not created default objects for target "
						<< glu::getTextureTargetStr(texture_targets[j]) << "." << tcu::TestLog::EndMessage;
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint i = 0; i < textures_count; ++i)
	{
		if (textures_legacy[i])
		{
			gl.deleteTextures(1, &textures_legacy[i]);

			textures_legacy[i] = 0;
		}

		for (glw::GLuint j = 0; j < texture_targets_count; ++j)
		{
			if (textures_dsa[j][i])
			{
				gl.deleteTextures(1, &textures_dsa[j][i]);

				textures_dsa[j][i] = 0;
			}
		}
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}